

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_collection.cpp
# Opt level: O2

void duckdb::ColumnDataCopy<duckdb::interval_t>
               (ColumnDataMetaData *meta_data,UnifiedVectorFormat *source_data,Vector *source,
               idx_t offset,idx_t copy_count)

{
  ushort uVar1;
  ColumnDataCollectionSegment *this;
  ColumnDataAppendState *state;
  sel_t *psVar2;
  undefined8 uVar3;
  bool bVar4;
  interval_t *source_data_1;
  reference pvVar5;
  ColumnDataAllocator *this_00;
  data_ptr_t pdVar6;
  ulong uVar7;
  idx_t iVar8;
  idx_t iVar9;
  interval_t *result_data;
  ulong uVar10;
  VectorDataIndex prev_index;
  ValidityMask result_validity;
  idx_t local_a0;
  TemplatedValidityMask<unsigned_long> local_50;
  
  this = meta_data->segment;
  state = meta_data->state;
  prev_index.index = (meta_data->vector_data_index).index;
  local_a0 = offset;
  while (copy_count != 0) {
    pvVar5 = vector<duckdb::VectorMetaData,_true>::get<true>(&this->vector_data,prev_index.index);
    uVar7 = (ulong)(0x800 - pvVar5->count);
    if (copy_count <= uVar7) {
      uVar7 = copy_count;
    }
    this_00 = shared_ptr<duckdb::ColumnDataAllocator,_true>::operator->(&this->allocator);
    pdVar6 = ColumnDataAllocator::GetDataPointer
                       (this_00,&state->current_chunk_state,pvVar5->block_id,pvVar5->offset);
    local_50.validity_mask = (unsigned_long *)(pdVar6 + 0x8000);
    local_50.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_50.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_50.capacity = 0x800;
    if (pvVar5->count == 0) {
      TemplatedValidityMask<unsigned_long>::SetAllValid(&local_50,0x800);
    }
    uVar10 = uVar7;
    iVar8 = local_a0;
    if ((source_data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      while (uVar10 != 0) {
        psVar2 = source_data->sel->sel_vector;
        iVar9 = iVar8;
        if (psVar2 != (sel_t *)0x0) {
          iVar9 = (idx_t)psVar2[iVar8];
        }
        uVar1 = pvVar5->count;
        uVar3 = *(undefined8 *)(source_data->data + iVar9 * 0x10 + 8);
        *(undefined8 *)(pdVar6 + (ulong)uVar1 * 0x10) =
             *(undefined8 *)(source_data->data + iVar9 * 0x10);
        *(undefined8 *)(pdVar6 + (ulong)uVar1 * 0x10 + 8) = uVar3;
        pdVar6 = pdVar6 + 0x10;
        uVar10 = uVar10 - 1;
        iVar8 = iVar8 + 1;
      }
    }
    else {
      for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
        psVar2 = source_data->sel->sel_vector;
        if (psVar2 == (sel_t *)0x0) {
          iVar8 = local_a0 + uVar10;
        }
        else {
          iVar8 = (idx_t)psVar2[local_a0 + uVar10];
        }
        bVar4 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&(source_data->validity).super_TemplatedValidityMask<unsigned_long>,iVar8
                          );
        if (bVar4) {
          uVar1 = pvVar5->count;
          uVar3 = *(undefined8 *)(source_data->data + iVar8 * 0x10 + 8);
          *(undefined8 *)(pdVar6 + (ulong)uVar1 * 0x10) =
               *(undefined8 *)(source_data->data + iVar8 * 0x10);
          *(undefined8 *)(pdVar6 + (ulong)uVar1 * 0x10 + 8) = uVar3;
        }
        else {
          TemplatedValidityMask<unsigned_long>::SetInvalid(&local_50,pvVar5->count + uVar10);
        }
        pdVar6 = pdVar6 + 0x10;
      }
    }
    pvVar5->count = pvVar5->count + (short)uVar7;
    copy_count = copy_count - uVar7;
    if (copy_count != 0) {
      if ((pvVar5->next_data).index == 0xffffffffffffffff) {
        ColumnDataCollectionSegment::AllocateVector
                  (this,&source->type,meta_data->chunk_data,&state->current_chunk_state,prev_index);
      }
      pvVar5 = vector<duckdb::VectorMetaData,_true>::get<true>(&this->vector_data,prev_index.index);
      prev_index.index = (pvVar5->next_data).index;
    }
    local_a0 = local_a0 + uVar7;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_50.validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  return;
}

Assistant:

static void ColumnDataCopy(ColumnDataMetaData &meta_data, const UnifiedVectorFormat &source_data, Vector &source,
                           idx_t offset, idx_t copy_count) {
	TemplatedColumnDataCopy<StandardValueCopy<T>>(meta_data, source_data, source, offset, copy_count);
}